

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O3

FExecList * C_ParseExecFile(char *file,FExecList *exec)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  size_t sVar5;
  undefined1 *puVar6;
  long lVar7;
  char cmd [4096];
  undefined8 uStack_1030;
  char local_1028 [4096];
  
  uStack_1030 = 0x35bed7;
  __stream = fopen(file,"r");
  if (__stream == (FILE *)0x0) {
    uStack_1030 = 0x35bff0;
    Printf("Could not open \"%s\"\n",file);
  }
  else {
    uStack_1030 = 0x35bef6;
    pcVar4 = fgets(local_1028,0xfff,__stream);
    if (pcVar4 != (char *)0x0) {
      do {
        uStack_1030 = 0x35bf0d;
        sVar5 = strlen(local_1028);
        if (local_1028[sVar5 - 1] == '\n') {
          local_1028[sVar5 - 1] = '\0';
          lVar7 = (long)&uStack_1030 + 6;
        }
        else {
          lVar7 = (long)&uStack_1030 + 7;
        }
        puVar6 = (undefined1 *)(lVar7 + sVar5);
        if (local_1028 < puVar6) {
          lVar7 = 0;
          bVar1 = false;
          do {
            if (local_1028[lVar7] == '\"') {
              bVar1 = (bool)(bVar1 ^ 1);
            }
            else {
              bVar2 = !bVar1;
              bVar1 = true;
              if (((bVar2) && (bVar1 = false, local_1028[lVar7] == '/')) &&
                 (local_1028[lVar7 + 1] == '/')) {
                if (lVar7 == 0) goto LAB_0035bf92;
                local_1028[lVar7] = '\0';
                goto LAB_0035bf68;
              }
            }
            lVar7 = lVar7 + 1;
          } while ((long)puVar6 - (long)local_1028 != lVar7);
          if (puVar6 != local_1028) {
LAB_0035bf68:
            if (exec == (FExecList *)0x0) {
              uStack_1030 = 0x35bf77;
              exec = (FExecList *)operator_new(0x20);
              (exec->Commands).Array = (FString *)0x0;
              (exec->Commands).Most = 0;
              (exec->Commands).Count = 0;
              (exec->Pullins).Array = (FString *)0x0;
              (exec->Pullins).Most = 0;
              (exec->Pullins).Count = 0;
            }
            uStack_1030 = 0x35bf92;
            FExecList::AddCommand(exec,local_1028,file);
          }
        }
LAB_0035bf92:
        uStack_1030 = 0x35bfa2;
        pcVar4 = fgets(local_1028,0xfff,__stream);
      } while (pcVar4 != (char *)0x0);
    }
    uStack_1030 = 0x35bfc0;
    iVar3 = feof(__stream);
    if (iVar3 == 0) {
      uStack_1030 = 0x35bfd5;
      Printf("Error parsing \"%s\"\n",file);
    }
    uStack_1030 = 0x35bfdd;
    fclose(__stream);
  }
  return exec;
}

Assistant:

FExecList *C_ParseExecFile(const char *file, FExecList *exec)
{
	FILE *f;
	char cmd[4096];
	int retval = 0;

	if ( (f = fopen (file, "r")) )
	{
		while (fgets(cmd, countof(cmd)-1, f))
		{
			// Comments begin with //
			char *stop = cmd + strlen(cmd) - 1;
			char *comment = cmd;
			int inQuote = 0;

			if (*stop == '\n')
				*stop-- = 0;

			while (comment < stop)
			{
				if (*comment == '\"')
				{
					inQuote ^= 1;
				}
				else if (!inQuote && *comment == '/' && *(comment + 1) == '/')
				{
					break;
				}
				comment++;
			}
			if (comment == cmd)
			{ // Comment at line beginning
				continue;
			}
			else if (comment < stop)
			{ // Comment in middle of line
				*comment = 0;
			}
			if (exec == NULL)
			{
				exec = new FExecList;
			}
			exec->AddCommand(cmd, file);
		}
		if (!feof(f))
		{
			Printf("Error parsing \"%s\"\n", file);
		}
		fclose(f);
	}
	else
	{
		Printf ("Could not open \"%s\"\n", file);
	}
	return exec;
}